

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

string * __thiscall
glu::getProgramInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,glu *this,Functions *gl,deUint32 program)

{
  code *pcVar1;
  deUint32 err;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 in_register_0000000c;
  allocator<char> local_5d;
  undefined4 local_5c;
  allocator local_55 [19];
  allocator_type local_42;
  value_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> infoLog;
  int local_20;
  int unusedLen;
  int infoLogLen;
  deUint32 program_local;
  Functions *gl_local;
  
  unusedLen = (int)gl;
  local_20 = 0;
  _infoLogLen = this;
  gl_local = (Functions *)__return_storage_ptr__;
  (**(code **)(this + 0x9d8))
            ((ulong)gl & 0xffffffff,0x8b84,&local_20,CONCAT44(in_register_0000000c,program));
  err = (**(code **)(_infoLogLen + 0x800))();
  checkError(err,"glGetProgramiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x98);
  if (local_20 < 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    iVar2 = local_20 + 3;
    local_41 = '\0';
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_40,(long)iVar2,&local_41,&local_42);
    std::allocator<char>::~allocator(&local_42);
    iVar2 = unusedLen;
    pcVar1 = *(code **)(_infoLogLen + 0x988);
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_40,0);
    (*pcVar1)(iVar2,(int)sVar3 + -1,
              &infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,pvVar4);
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_40,(long)((int)sVar3 + -1));
    if (*pvVar4 == '\0') {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pvVar4,&local_5d);
      std::allocator<char>::~allocator(&local_5d);
    }
    else {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pvVar4,sVar3,local_55);
      std::allocator<char>::~allocator((allocator<char> *)local_55);
    }
    local_5c = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getProgramInfoLog (const glw::Functions& gl, deUint32 program)
{
	int infoLogLen = 0;
	int unusedLen;

	gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLen);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv()");

	if (infoLogLen > 0)
	{
		// The INFO_LOG_LENGTH query and the buffer query implementations have
		// very commonly off-by-one errors. Try to work around these issues.

		// add tolerance for off-by-one in log length, buffer write, and for terminator
		std::vector<char> infoLog(infoLogLen + 3, '\0');

		// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
		gl.getProgramInfoLog(program, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

		// return whole buffer if null terminator was overwritten
		if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			return std::string(&infoLog[0], infoLog.size());

		// read as C string. infoLog is guaranteed to be 0-terminated
		return std::string(&infoLog[0]);
	}
	return std::string();
}